

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * IR::Instr::FindSingleDefInstr(OpCode opCode,Opnd *src)

{
  Instr *pIVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  
  bVar2 = Opnd::IsRegOpnd(src);
  if (((bVar2) && (pRVar3 = Opnd::AsRegOpnd(src), pRVar3 != (RegOpnd *)0x0)) &&
     (pIVar1 = (pRVar3->m_sym->field_5).m_instrDef,
     (pIVar1 != (Instr *)0x0 & pRVar3->m_sym->field_0x18) == 1)) {
    pIVar4 = (Instr *)0x0;
    if (pIVar1->m_opcode == opCode) {
      pIVar4 = pIVar1;
    }
  }
  else {
    pIVar4 = (Instr *)0x0;
  }
  return pIVar4;
}

Assistant:

Instr*
Instr::FindSingleDefInstr(Js::OpCode opCode, Opnd* src)
{
    RegOpnd* src1 = src->IsRegOpnd() ? src->AsRegOpnd() : nullptr;

    return  src1 &&
        src1->m_sym->IsSingleDef() &&
        src1->m_sym->GetInstrDef()->m_opcode == opCode ?
        src1->m_sym->GetInstrDef() :
        nullptr;
}